

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable *table)

{
  ImGuiTableColumn *pIVar1;
  uint uVar2;
  long lVar3;
  int column_n;
  ulong uVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  
  uVar2 = table->ColumnsCount;
  lVar3 = 0;
  uVar4 = 0;
  if (0 < (int)uVar2) {
    uVar4 = (ulong)uVar2;
  }
  fVar6 = 0.0;
  fVar7 = 0.0;
  for (; uVar4 * 0x68 - lVar3 != 0; lVar3 = lVar3 + 0x68) {
    pIVar1 = (table->Columns).Data;
    if (((&pIVar1->IsEnabled)[lVar3] == true) &&
       ((*(byte *)((long)&pIVar1->Flags + lVar3) & 8) != 0)) {
      fVar7 = fVar7 + *(float *)((long)&pIVar1->StretchWeight + lVar3);
      fVar6 = fVar6 + *(float *)((long)&pIVar1->WidthRequest + lVar3);
    }
  }
  lVar3 = 0;
  for (lVar5 = 0; lVar5 < (int)uVar2; lVar5 = lVar5 + 1) {
    pIVar1 = (table->Columns).Data;
    if (((&pIVar1->IsEnabled)[lVar3] == true) &&
       ((*(byte *)((long)&pIVar1->Flags + lVar3) & 8) != 0)) {
      *(float *)((long)&pIVar1->StretchWeight + lVar3) =
           (*(float *)((long)&pIVar1->WidthRequest + lVar3) / fVar6) * fVar7;
      uVar2 = table->ColumnsCount;
    }
    lVar3 = lVar3 + 0x68;
  }
  return;
}

Assistant:

void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable* table)
{
    IM_ASSERT(table->LeftMostStretchedColumn != -1 && table->RightMostStretchedColumn != -1);

    // Measure existing quantity
    float visible_weight = 0.0f;
    float visible_width = 0.0f;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (!column->IsEnabled || !(column->Flags & ImGuiTableColumnFlags_WidthStretch))
            continue;
        IM_ASSERT(column->StretchWeight > 0.0f);
        visible_weight += column->StretchWeight;
        visible_width += column->WidthRequest;
    }
    IM_ASSERT(visible_weight > 0.0f && visible_width > 0.0f);

    // Apply new weights
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (!column->IsEnabled || !(column->Flags & ImGuiTableColumnFlags_WidthStretch))
            continue;
        column->StretchWeight = (column->WidthRequest / visible_width) * visible_weight;
        IM_ASSERT(column->StretchWeight > 0.0f);
    }
}